

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)>::
UntypedPerformAction
          (FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<double> *pAVar1;
  Action<double_(const_char_*,_char_**,___locale_struct_*)> action;
  linked_ptr<testing::ActionInterface<double_(const_char_*,_char_**,___locale_struct_*)>_> local_20;
  
  linked_ptr<testing::ActionInterface<double(char_const*,char**,__locale_struct*)>>::
  copy<testing::ActionInterface<double(char_const*,char**,__locale_struct*)>>
            ((linked_ptr<testing::ActionInterface<double(char_const*,char**,__locale_struct*)>> *)
             &local_20,
             (linked_ptr<testing::ActionInterface<double_(const_char_*,_char_**,___locale_struct_*)>_>
              *)untyped_action);
  pAVar1 = ActionResultHolder<double>::PerformAction<double(char_const*,char**,__locale_struct*)>
                     ((Action<double_(const_char_*,_char_**,___locale_struct_*)> *)&local_20,
                      (ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<double_(const_char_*,_char_**,___locale_struct_*)>_>::
  ~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }